

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void unscaleSolution(HighsSolution *solution,HighsScale *scale)

{
  double dVar1;
  double dVar2;
  const_reference pvVar3;
  reference pvVar4;
  long in_RSI;
  long in_RDI;
  HighsInt iRow;
  HighsInt iCol;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < *(int *)(in_RSI + 8); local_14 = local_14 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),(long)local_14);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_14);
    *pvVar4 = dVar1 * *pvVar4;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x18),(long)local_14);
    dVar1 = *pvVar3;
    dVar2 = *(double *)(in_RSI + 0x10);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)local_14);
    *pvVar4 = *pvVar4 / (dVar1 / dVar2);
  }
  for (local_18 = 0; local_18 < *(int *)(in_RSI + 0xc); local_18 = local_18 + 1) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x30),(long)local_18);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x38),(long)local_18);
    *pvVar4 = *pvVar4 / dVar1;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x30),(long)local_18);
    dVar1 = *pvVar3;
    dVar2 = *(double *)(in_RSI + 0x10);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x50),(long)local_18);
    *pvVar4 = dVar1 * dVar2 * *pvVar4;
  }
  return;
}

Assistant:

void unscaleSolution(HighsSolution& solution, const HighsScale& scale) {
  assert(solution.col_value.size() == static_cast<size_t>(scale.num_col));
  assert(solution.col_dual.size() == static_cast<size_t>(scale.num_col));
  assert(solution.row_value.size() == static_cast<size_t>(scale.num_row));
  assert(solution.row_dual.size() == static_cast<size_t>(scale.num_row));

  for (HighsInt iCol = 0; iCol < scale.num_col; iCol++) {
    solution.col_value[iCol] *= scale.col[iCol];
    solution.col_dual[iCol] /= (scale.col[iCol] / scale.cost);
  }
  for (HighsInt iRow = 0; iRow < scale.num_row; iRow++) {
    solution.row_value[iRow] /= scale.row[iRow];
    solution.row_dual[iRow] *= (scale.row[iRow] * scale.cost);
  }
}